

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O3

int __thiscall cm::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  ulong uVar1;
  ulong in_RCX;
  EVP_PKEY_CTX *pEVar2;
  
  uVar1 = (this->view_)._M_len;
  pEVar2 = (EVP_PKEY_CTX *)(uVar1 - in_RCX);
  if (in_RCX <= uVar1) {
    if (pEVar2 < src) {
      src = pEVar2;
    }
    if (src != (EVP_PKEY_CTX *)0x0) {
      memcpy(dst,(this->view_)._M_str + in_RCX,(size_t)src);
    }
    return (int)src;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::copy");
}

Assistant:

String::size_type String::copy(char* dest, size_type count,
                               size_type pos) const
{
  return this->view_.copy(dest, count, pos);
}